

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O0

int runseasonalitytests(double *x,int N,int f,char *test)

{
  int iVar1;
  char *method;
  double crit;
  double stat;
  int mlags;
  int diff;
  char *test_local;
  int f_local;
  int N_local;
  double *x_local;
  
  _mlags = test;
  test_local._0_4_ = f;
  test_local._4_4_ = N;
  _f_local = x;
  iVar1 = strcmp(test,"ocsb");
  if (iVar1 == 0) {
    stat._0_4_ = 3;
    OCSBtest(_f_local,test_local._4_4_,(int)test_local,3,"aic",&crit,(double *)&method);
    stat._4_4_ = (uint)((double)method < crit);
  }
  else {
    iVar1 = strcmp(_mlags,"seas");
    if (iVar1 == 0) {
      method = (char *)0x3fe47ae147ae147b;
      SHtest(_f_local,test_local._4_4_,(int *)&test_local,1,&crit);
      stat._4_4_ = (uint)((double)method < crit);
    }
  }
  return stat._4_4_;
}

Assistant:

static int runseasonalitytests(double *x, int N,int f, const char * test) {
    int diff,mlags;
    double stat,crit;
    const char *method;

    if (!strcmp(test,"ocsb")) {
        mlags = 3;
        method = "aic";
        OCSBtest(x,N,f,mlags,method,&stat,&crit);
        diff = (stat > crit) ? 1 : 0;
    } else if (!strcmp(test,"seas")) {
        crit = 0.64;
        SHtest(x,N,&f,1,&stat);
        diff = (stat > crit) ? 1 : 0;
    }

    return diff;
}